

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visit(wasm::Expression*,wasm::IString_
          (void *this,Expression *curr,IString nextResult)

{
  Type *pTVar1;
  char **ppcVar2;
  Id IVar3;
  uintptr_t uVar4;
  uint *puVar5;
  pointer ppEVar6;
  Value *curr_00;
  _Base_ptr p_Var7;
  Name name;
  Name name_00;
  JsSign JVar8;
  size_t sVar9;
  ValueBuilder *this_00;
  size_t sVar10;
  bool bVar11;
  BasicType BVar12;
  Index IVar13;
  JsType JVar14;
  Ref args_2;
  Name *__k;
  mapped_type *pmVar15;
  size_type sVar16;
  long lVar17;
  Expression **ppEVar18;
  size_type sVar19;
  Ref RVar20;
  Ref RVar21;
  mapped_type *pmVar22;
  size_type sVar23;
  _Base_ptr p_Var24;
  NameScope scope;
  uint *puVar25;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_03;
  char *extraout_RDX_05;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  undefined8 *puVar26;
  pointer ppEVar27;
  _Base_ptr p_Var28;
  int iVar29;
  Type TVar30;
  Expression *pEVar32;
  Module *pMVar33;
  wasm2js *pwVar34;
  wasm *pwVar35;
  Ref in_R8;
  Ref in_R9;
  size_t i;
  ulong index;
  size_t sVar36;
  pointer pSVar37;
  ValueBuilder *this_01;
  size_t sVar38;
  uint uVar39;
  IString specific;
  IString nextResult_00;
  IString nextResult_01;
  IString nextResult_02;
  IString nextResult_03;
  IString specific_00;
  IString nextResult_04;
  IString nextResult_05;
  IString nextResult_06;
  IString nextResult_07;
  IString nextResult_08;
  IString nextResult_09;
  IString nextResult_10;
  IString nextResult_11;
  IString nextResult_12;
  IString nextResult_13;
  IString nextResult_14;
  IString nextResult_15;
  IString specific_01;
  IString nextResult_16;
  IString nextResult_17;
  IString nextResult_18;
  IString specific_02;
  IString nextResult_19;
  IString specific_03;
  IString nextResult_20;
  IString nextResult_21;
  IString specific_04;
  IString nextResult_22;
  IString nextResult_23;
  IString nextResult_24;
  IString key;
  IString key_00;
  IString nextResult_25;
  IString nextResult_26;
  IString op;
  IString nextResult_27;
  IString specific_05;
  IString nextResult_28;
  IString nextResult_29;
  IString nextResult_30;
  IString nextResult_31;
  IString nextResult_32;
  IString nextResult_33;
  IString op_00;
  IString key_01;
  IString nextResult_34;
  IString nextResult_35;
  IString op_01;
  IString key_02;
  IString nextResult_36;
  IString nextResult_37;
  IString nextResult_38;
  IString nextResult_39;
  IString op_02;
  IString specific_06;
  IString specific_07;
  IString nextResult_40;
  IString nextResult_41;
  IString op_03;
  IString nextResult_42;
  IString nextResult_43;
  IString nextResult_44;
  IString nextResult_45;
  IString specific_08;
  IString specific_09;
  IString nextResult_46;
  IString nextResult_47;
  IString nextResult_48;
  IString op_04;
  IString op_05;
  IString target;
  IString target_00;
  IString name_01;
  IString op_06;
  IString name_02;
  IString target_01;
  IString name_03;
  IString name_04;
  IString target_02;
  IString target_03;
  IString target_04;
  IString name_05;
  IString name_06;
  IString name_07;
  IString name_08;
  IString name_09;
  IString target_05;
  Name name_10;
  IString name_11;
  IString label;
  IString name_12;
  IString name_13;
  IString op_07;
  IString target_06;
  IString name_14;
  IString name_15;
  IString op_08;
  IString op_09;
  IString name_16;
  IString name_17;
  IString target_07;
  IString target_08;
  IString target_09;
  IString target_10;
  IString target_11;
  IString op_10;
  string_view sVar40;
  IString IVar41;
  Expression EVar42;
  HeapAndPointer HVar43;
  Name name_18;
  Name NVar44;
  Ref args_3;
  IString old;
  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  targetIndexes;
  undefined1 auStack_d8 [8];
  anon_class_40_5_73e85241 stopFurtherFallthrough;
  undefined1 local_a8 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> emittedTargets;
  Expression *local_68;
  Ref local_60;
  Ref theSwitch;
  Ref RStack_50;
  bool stoppedFurtherFallthrough;
  Ref local_48;
  undefined1 local_39;
  char cStack_38;
  undefined7 uStack_37;
  bool hoistedEndsWithUnreachable;
  char *extraout_RDX_02;
  char *extraout_RDX_04;
  char *extraout_RDX_06;
  ValueBuilder *pVVar31;
  
  IVar41.str._M_str = (Value *)nextResult.str._M_str;
  name_01.str._M_str = (char *)nextResult.str._M_len;
  args_3.inst = *(Value **)((long)this + 8);
  old.str._M_len = *(size_t *)((long)this + 0x10);
  *(char **)((long)this + 8) = name_01.str._M_str;
  *(Value **)((long)this + 0x10) = IVar41.str._M_str;
  sVar36 = _getGCData;
  pMVar33 = WASM_MEMORY_GROW;
  if (curr == (Expression *)0x0) {
LAB_00151871:
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<ExpressionProcessor, cashew::Ref>::visit(Expression *) [SubType = ExpressionProcessor, ReturnType = cashew::Ref]"
                 );
  }
  _cStack_38 = (Ref *)this;
  switch(curr->_id) {
  case BlockId:
    old.str._M_str = (char *)curr;
    sVar16 = std::
             set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
             ::count((set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                      *)((long)this + 0x178),(key_type *)&old.str._M_str);
    if (sVar16 == 0) {
      IVar41.str._M_str = cashew::ValueBuilder::makeBlock();
      uVar4 = curr[2].type.id;
      for (sVar36 = 0; this = _cStack_38, uVar4 != sVar36; sVar36 = sVar36 + 1) {
        ppEVar18 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)(curr + 2),sVar36);
        nextResult_32.str._M_str = (char *)_finalize;
        nextResult_32.str._M_len = (size_t)NO_RESULT;
        RVar20 = IString_(_cStack_38,*ppEVar18,nextResult_32);
        flattenAppend(IVar41.str._M_str,RVar20);
      }
      name_01.str._M_str = (char *)curr[1].type.id;
      if (name_01.str._M_str == (char *)0x0) break;
      RVar20.inst = (Value *)0x3;
      name_10.super_IString.str._M_str = name_01.str._M_str;
      name_10.super_IString.str._M_len = *(size_t *)(curr + 1);
      sVar40 = (string_view)fromName(wasm::Name,wasm::NameScope_(_cStack_38,name_10,Label);
LAB_00150f29:
      name_12.str._M_len = sVar40._M_str;
      name_12.str._M_str = (char *)IVar41.str._M_str;
      IVar41.str._M_str =
           cashew::ValueBuilder::makeLabel((ValueBuilder *)sVar40._M_len,name_12,RVar20);
      break;
    }
    ppEVar18 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                          (curr + 2),0);
    pEVar32 = *ppEVar18;
    IVar41.str._M_str = _finalize;
    name_01.str._M_str = NO_RESULT;
    goto LAB_001506b5;
  case IfId:
    nextResult_13.str._M_str = (char *)cashew::RSHIFT;
    nextResult_13.str._M_len = EXPRESSION_RESULT;
    IVar41.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_13);
    nextResult_14.str._M_str = (char *)_finalize;
    nextResult_14.str._M_len = (size_t)NO_RESULT;
    RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_14);
    if (*(Expression **)(curr + 2) == (Expression *)0x0) {
      RVar21.inst = (Value *)0x0;
    }
    else {
      nextResult_15.str._M_str = (char *)_finalize;
      nextResult_15.str._M_len = (size_t)NO_RESULT;
      RVar21 = IString_(this,*(Expression **)(curr + 2),nextResult_15);
    }
    IVar41.str._M_str = cashew::ValueBuilder::makeIf(IVar41.str._M_str,RVar20,RVar21);
    break;
  case LoopId:
    old.str._M_str = *(char **)(curr + 1);
    uVar4 = curr[1].type.id;
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar4,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar4 >> 0x20,0);
    if (uVar4 != 0) {
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)((long)this + 0x1d8),(value_type *)&old.str._M_str);
      IVar41.str._M_str = *(Value **)(curr + 2);
      RVar20 = IString_(this,IVar41.str._M_str,(IString)*(string_view *)((long)this + 8));
      if (*(long *)(*(long *)(curr + 2) + 8) == 0) {
        RVar20 = blockify(cashew::Ref_(RVar20.inst,IVar41.str._M_str);
        name.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
        name.super_IString.str._M_len = (size_t)old.str._M_str;
        name.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
        IVar41 = fromName(wasm::Name,wasm::NameScope_(this,name,Label);
        label.str._M_str = IVar41.str._M_str;
        label.str._M_len = (size_t)label.str._M_str;
        IVar41.str._M_str = cashew::ValueBuilder::makeBreak((ValueBuilder *)IVar41.str._M_len,label)
        ;
        flattenAppend(RVar20,IVar41.str._M_str);
      }
      else if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
        __assert_fail("curr->body->type == Type::none",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                      ,0x4ab,
                      "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitLoop(Loop *)"
                     );
      }
      IVar41.str._M_str = cashew::ValueBuilder::makeDouble(1.0);
      IVar41.str._M_str = cashew::ValueBuilder::makeWhile(IVar41.str._M_str,RVar20);
      name_00.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
      name_00.super_IString.str._M_len = (size_t)old.str._M_str;
      name_00.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
      RVar20.inst = (Value *)0x3;
      sVar40 = (string_view)fromName(wasm::Name,wasm::NameScope_(this,name_00,Label);
      goto LAB_00150f29;
    }
    pEVar32 = *(Expression **)(curr + 2);
    goto LAB_001506b5;
  case BreakId:
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = curr[2].type.id;
    if (emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
      IVar41.str._M_str = makeBreakOrContinue(wasm::Name_(this,(Name)curr[1]);
      break;
    }
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(curr + 2);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&old.str._M_str;
    old.str._M_str = *(char **)curr;
    uVar4 = (curr->type).id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *(undefined8 *)(curr + 1);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)curr[1].type.id;
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar4,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar4 >> 0x20,0);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pEVar32 = (Expression *)local_a8;
    local_a8[0] = 2;
    emittedTargets._M_t._M_impl._0_8_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    goto LAB_001506b5;
  case SwitchId:
    nextResult_09.str._M_str = (char *)cashew::RSHIFT;
    nextResult_09.str._M_len = EXPRESSION_RESULT;
    local_68 = curr;
    IVar41.str._M_str = IString_(this,(Expression *)curr[4].type.id,nextResult_09);
    IVar41.str._M_str = (Value *)makeJsCoercion(IVar41.str._M_str,JS_INT);
    IVar41.str._M_str = cashew::ValueBuilder::makeSwitch(IVar41.str._M_str);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&targetIndexes
    ;
    targetIndexes._M_t._M_impl._0_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_60 = IVar41.str._M_str;
    for (index = 0; index < curr[1].type.id; index = index + 1) {
      __k = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                      ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(curr + 1),index);
      pmVar15 = std::
                map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                              *)&old.str._M_str,__k);
      local_a8._0_4_ = (int)index;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (pmVar15,(uint *)local_a8);
    }
    pmVar22 = std::
              map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
              ::operator[]((map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                            *)((long)this + 0x1a8),(key_type *)&local_68);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&emittedTargets;
    emittedTargets._M_t._M_impl._0_8_ = (ulong)(uint)emittedTargets._M_t._M_impl._4_4_ << 0x20;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_39 = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(pmVar22->
                 super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (pSVar37 = (pmVar22->
                   super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        pSVar37 != (pointer)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        pSVar37 = pSVar37 + 1) {
      auStack_d8 = *(undefined1 (*) [8])&(pSVar37->target).super_IString.str;
      stopFurtherFallthrough.stoppedFurtherFallthrough =
           *(bool **)((long)&(pSVar37->target).super_IString.str + 8);
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)local_a8,(Name *)auStack_d8);
      if (stopFurtherFallthrough.stoppedFurtherFallthrough == (bool *)curr[3].type.id) {
        cashew::ValueBuilder::appendDefaultToSwitch(IVar41.str._M_str);
      }
      else {
        pmVar15 = std::
                  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&old.str._M_str,(key_type *)auStack_d8);
        puVar5 = (pmVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar25 = (pmVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start; puVar25 != puVar5;
            puVar25 = puVar25 + 1) {
          RVar20 = cashew::ValueBuilder::makeDouble((double)*puVar25);
          cashew::ValueBuilder::appendCaseToSwitch(IVar41.str._M_str,RVar20);
        }
      }
      ppEVar6 = *(pointer *)
                 ((long)&(pSVar37->code).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl + 8);
      for (ppEVar27 = (pSVar37->code).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar27 != ppEVar6;
          ppEVar27 = ppEVar27 + 1) {
        curr_00 = (Value *)*ppEVar27;
        nextResult_31.str._M_str = (char *)_finalize;
        nextResult_31.str._M_len = (size_t)NO_RESULT;
        RVar20.inst = curr_00;
        RVar21 = IString_(_cStack_38,(Expression *)curr_00,nextResult_31);
        RVar20 = blockify(cashew::Ref_(RVar21.inst,RVar20);
        cashew::ValueBuilder::appendCodeToSwitch(IVar41.str._M_str,RVar20,false);
        local_39 = (curr_00->field_1).str.str._M_len == 1;
      }
      this = _cStack_38;
    }
    auStack_d8 = (undefined1  [8])((long)&theSwitch.inst + 7);
    theSwitch.inst._7_1_ = 0;
    stopFurtherFallthrough.hoistedCases = (mapped_type *)&local_39;
    stopFurtherFallthrough.hoistedEndsWithUnreachable = (bool *)&local_60;
    stopFurtherFallthrough.stoppedFurtherFallthrough = (bool *)pmVar22;
    stopFurtherFallthrough.theSwitch = (Ref *)this;
    for (p_Var24 = targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        pEVar32 = local_68, p_Var24 != (_Rb_tree_node_base *)&targetIndexes;
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
      sVar23 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                         ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                          local_a8,(key_type *)(p_Var24 + 1));
      if ((sVar23 == 0) &&
         (processExpression::ExpressionProcessor::visitSwitch::anon_class_40_5_73e85241::operator()
                    ((anon_class_40_5_73e85241 *)auStack_d8),
         p_Var24[1]._M_parent != (_Base_ptr)local_68[3].type.id)) {
        p_Var7 = p_Var24[1]._M_right;
        for (p_Var28 = p_Var24[1]._M_left; IVar41.str._M_str = local_60.inst, p_Var28 != p_Var7;
            p_Var28 = (_Base_ptr)&p_Var28->field_0x4) {
          RVar20 = cashew::ValueBuilder::makeDouble((double)p_Var28->_M_color);
          cashew::ValueBuilder::appendCaseToSwitch(IVar41.str._M_str,RVar20);
        }
        RVar20.inst = *(Value **)(p_Var24 + 1);
        RVar21 = makeBreakOrContinue(wasm::Name_(_cStack_38,(Name)*(string_view *)(p_Var24 + 1));
        RVar20 = blockify(cashew::Ref_(RVar21.inst,RVar20);
        cashew::ValueBuilder::appendCodeToSwitch(IVar41.str._M_str,RVar20,false);
      }
    }
    sVar23 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                       ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                        local_a8,(key_type *)(local_68 + 3));
    if (sVar23 == 0) {
      processExpression::ExpressionProcessor::visitSwitch::anon_class_40_5_73e85241::operator()
                ((anon_class_40_5_73e85241 *)auStack_d8);
      cashew::ValueBuilder::appendDefaultToSwitch(local_60);
      RVar20.inst = local_60.inst;
      IVar41.str._M_str = *(Value **)(pEVar32 + 3);
      RVar21 = makeBreakOrContinue(wasm::Name_(_cStack_38,(Name)pEVar32[3]);
      IVar41.str._M_str = blockify(cashew::Ref_(RVar21.inst,IVar41.str._M_str);
      cashew::ValueBuilder::appendCodeToSwitch(RVar20,IVar41.str._M_str,false);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_a8);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&old.str._M_str);
    this = _cStack_38;
    IVar41.str._M_str = local_60.inst;
    break;
  case CallId:
    if (curr[4]._id == BlockId) {
      ppcVar2 = &old.str._M_str;
      Fatal::Fatal((Fatal *)ppcVar2);
      Fatal::operator<<((Fatal *)ppcVar2,(char (*) [40])"tail calls not yet supported in wasm2js");
      goto LAB_00151ab1;
    }
    IVar41 = fromName(wasm::Name,wasm::NameScope_(this,(Name)curr[3],Top);
    target_01.str._M_str = (uintptr_t)IVar41.str._M_str;
    target_01.str._M_len = target_01.str._M_str;
    local_a8 = (undefined1  [8])
               cashew::ValueBuilder::makeCall((ValueBuilder *)IVar41.str._M_len,target_01);
    _cStack_38 = (Ref *)CONCAT71(uStack_37,1);
    if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
      target_01.str._M_str = *(uintptr_t *)(curr + 3);
      NVar44.super_IString.str._M_str = (char *)target_01.str._M_str;
      NVar44.super_IString.str._M_len = *(size_t *)((long)this + 0x20);
      lVar17 = ::wasm::Module::getFunction(NVar44);
      _cStack_38 = (Ref *)CONCAT71(uStack_37,*(long *)(lVar17 + 0x20) != 0);
    }
    uVar4 = curr[1].type.id;
    targetIndexes._M_t._M_impl._0_8_ = 0;
    old.str._M_str = (char *)(curr + 1);
    while ((targetIndexes._M_t._M_impl._0_8_ != uVar4 || ((Expression *)old.str._M_str != curr + 1))
          ) {
      ppEVar18 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&old.str._M_str);
      pEVar32 = *ppEVar18;
      nextResult_18.str._M_str = (char *)cashew::RSHIFT;
      nextResult_18.str._M_len = EXPRESSION_RESULT;
      TVar30.id = (uintptr_t)pEVar32;
      target_01.str._M_str = (uintptr_t)IString_(this,pEVar32,nextResult_18);
      if (cStack_38 != '\0') {
        JVar14 = ::wasm::wasmToJsType((wasm *)(pEVar32->type).id,TVar30);
        target_01.str._M_str = makeJsCoercion((Ref)target_01.str._M_str,JVar14);
      }
      puVar26 = (undefined8 *)cashew::Ref::operator[]((uint)local_a8);
      cashew::Value::push_back((Value *)*puVar26,(Ref)target_01.str._M_str);
      targetIndexes._M_t._M_impl._0_8_ = targetIndexes._M_t._M_impl._0_8_ + 1;
    }
    IVar41.str._M_str = (Value *)local_a8;
    if (cStack_38 == '\0') break;
    pwVar35 = (wasm *)(curr->type).id;
    goto LAB_0015116b;
  case CallIndirectId:
    IVar41.str._M_str = visitCallIndirect(wasm::CallIndirect__(this,(CallIndirect *)curr);
    break;
  case LocalGetId:
    sVar40 = (string_view)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    scope = Local;
    goto LAB_0015030a;
  case LocalSetId:
    pEVar32 = (Expression *)curr[1].type.id;
    EVar42 = (Expression)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    name_01.str._M_str = (char *)0x2;
    goto LAB_00150689;
  case GlobalGetId:
  case RefFuncId:
    sVar40 = *(string_view *)(curr + 1);
    scope = Top;
LAB_0015030a:
    sVar40 = (string_view)fromName(wasm::Name,wasm::NameScope_(this,(Name)sVar40,scope);
    name_01.str._M_str = sVar40._M_str;
LAB_00150315:
    name_02.str._M_str = sVar40._M_str;
    name_02.str._M_len = (size_t)name_01.str._M_str;
    IVar41.str._M_str = cashew::ValueBuilder::makeName((ValueBuilder *)sVar40._M_len,name_02);
    break;
  case GlobalSetId:
    pEVar32 = *(Expression **)(curr + 2);
    EVar42 = curr[1];
    name_01.str._M_str = (char *)0x1;
LAB_00150689:
    name_18.super_IString.str._M_len = EVar42.type.id;
    name_18.super_IString.str._M_str = name_01.str._M_str;
    IVar41.str._M_str =
         makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
                   (this,pEVar32,EVar42._0_8_,name_18,(NameScope)in_R9.inst);
    break;
  case LoadId:
    if ((*(ulong *)(curr + 2) != 0) && (*(ulong *)(curr + 2) != (ulong)curr[1]._id)) {
      __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                    ,0x593,
                    "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitLoad(Load *)"
                   );
    }
    IVar41.str._M_str =
         makePointer(wasm::Expression*,wasm::Address_
                   (this,*(Expression **)(curr + 3),(Address)curr[1].type.id);
    pTVar1 = &curr->type;
    BVar12 = Type::getBasic(pTVar1);
    if (BVar12 == f64) {
      name_11.str._M_str = extraout_RDX;
      name_11.str._M_len = _vtable;
      RVar20 = cashew::ValueBuilder::makeName(cashew::HEAPF64,name_11);
      iVar29 = 3;
    }
    else {
      if (BVar12 == f32) {
        puVar26 = &cashew::HEAPF32;
      }
      else {
        if (BVar12 != i32) {
          Fatal::Fatal((Fatal *)&old.str._M_str);
          std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                          "Unhandled type in load: ");
          Fatal::operator<<((Fatal *)&old.str._M_str,pTVar1);
          goto LAB_00151ab1;
        }
        IVar3 = curr[1]._id;
        if (IVar3 != BreakId) {
          if (IVar3 == IfId) {
            bVar11 = LoadUtils::isSignRelevant((Load *)curr);
            if ((bVar11) && (curr[1].field_0x1 != '\0')) {
              puVar26 = &cashew::HEAP16;
            }
            else {
              puVar26 = &cashew::HEAPU16;
            }
            name_16.str._M_str = extraout_RDX_08;
            name_16.str._M_len = puVar26[1];
            RVar20 = cashew::ValueBuilder::makeName((ValueBuilder *)*puVar26,name_16);
            iVar29 = 1;
          }
          else {
            if (IVar3 != BlockId) {
              Fatal::Fatal((Fatal *)&old.str._M_str);
              std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                              "Unhandled number of bytes in i32 load: ");
              Fatal::operator<<((Fatal *)&old.str._M_str,&curr[1]._id);
              goto LAB_00151ab1;
            }
            bVar11 = LoadUtils::isSignRelevant((Load *)curr);
            if ((bVar11) && (curr[1].field_0x1 != '\0')) {
              puVar26 = &cashew::HEAP8;
            }
            else {
              puVar26 = &cashew::HEAPU8;
            }
            name_17.str._M_str = extraout_RDX_00;
            name_17.str._M_len = puVar26[1];
            RVar20 = cashew::ValueBuilder::makeName((ValueBuilder *)*puVar26,name_17);
            iVar29 = 0;
          }
          goto LAB_001510c9;
        }
        puVar26 = &cashew::HEAP32;
      }
      name_14.str._M_str = extraout_RDX;
      name_14.str._M_len = puVar26[1];
      RVar20 = cashew::ValueBuilder::makeName((ValueBuilder *)*puVar26,name_14);
      iVar29 = 2;
    }
LAB_001510c9:
    target_01.str._M_str = (uintptr_t)cashew::ValueBuilder::makePtrShift(IVar41.str._M_str,iVar29);
    IVar41.str._M_str = cashew::ValueBuilder::makeSub(RVar20,(Ref)target_01.str._M_str);
    if ((char)curr[2].type.id == '\x01') {
      name_15.str._M_str = extraout_RDX_09;
      name_15.str._M_len = _makeJsCoercedZero;
      old.str._M_str = (char *)IVar41.str._M_str;
      IVar41.str._M_str = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_15);
      key_02.str._M_str = (char *)&cashew::LOAD;
      key_02.str._M_len = std::cerr;
      IVar41.str._M_str = cashew::ValueBuilder::makeDot(IVar41.str._M_str,cashew::LOAD,key_02);
      IVar41.str._M_str = cashew::ValueBuilder::makeCall(IVar41.str._M_str);
      uVar39 = (int)&old + 8;
      puVar26 = (undefined8 *)cashew::Ref::operator[](uVar39);
      cashew::ValueBuilder::appendToCall(IVar41.str._M_str,(Value *)*puVar26);
      puVar26 = (undefined8 *)cashew::Ref::operator[](uVar39);
      target_01.str._M_str = *puVar26;
      cashew::ValueBuilder::appendToCall(IVar41.str._M_str,(Ref)target_01.str._M_str);
    }
    if ((*(int *)(*this + 100) != 0) && ((*(byte *)((long)this + 0x28) & 1) == 0)) break;
    pwVar35 = (wasm *)pTVar1->id;
    old.str._M_str = (char *)IVar41.str._M_str;
LAB_0015116b:
    JVar14 = ::wasm::wasmToJsType(pwVar35,target_01.str._M_str);
    goto LAB_00151434;
  case StoreId:
    IVar41.str._M_str = visitStore(wasm::Store__(this,(Store *)curr);
    break;
  case ConstId:
    IVar41.str._M_str =
         visitConst(wasm::Const__(curr,(Const *)&switchD_0014fd4e::switchdataD_0017f030);
    break;
  case UnaryId:
    BVar12 = Type::getBasic(&curr->type);
    sVar10 = ABI::wasm2js::GET_STASHED_BITS;
    this_00 = cashew::B_NOT;
    sVar38 = _str;
    this_01 = cashew::L_NOT;
    sVar9 = __S_eq;
    pVVar31 = cashew::MINUS;
    sVar36 = ABI::wasm2js::TABLE_COPY;
    pMVar33 = MATH_CLZ32;
    if (1 < BVar12 - f32) {
      if (BVar12 != i32) {
        Fatal::Fatal((Fatal *)&old.str._M_str);
        std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                        "Unhandled type in unary: ");
        Fatal::operator<<((Fatal *)&old.str._M_str,(Unary *)curr);
        goto LAB_00151ab1;
      }
      iVar29 = *(int *)(curr + 1);
      IVar41.str._M_str = cashew::RSHIFT;
      if (iVar29 - 0x14U < 0xe) {
        specific_08.str._M_str =
             (char *)((long)&switchD_00150ff2::switchdataD_0017f3cc +
                     (long)(int)(&switchD_00150ff2::switchdataD_0017f3cc)[iVar29 - 0x14U]);
        switch(iVar29) {
        case 0x14:
          nextResult_47.str._M_str = (char *)cashew::RSHIFT;
          nextResult_47.str._M_len = EXPRESSION_RESULT;
          RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_47);
          break;
        default:
          goto switchD_00150e20_caseD_31;
        case 0x19:
        case 0x1d:
          goto switchD_00150e20_caseD_34;
        case 0x1b:
        case 0x1f:
          goto switchD_00150e20_caseD_35;
        case 0x21:
          specific_08.str._M_len = std::cout;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_F32,specific_08);
          specific_09.str._M_str = specific_08.str._M_str;
          specific_09.str._M_len = _operator<<;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_I32,specific_09);
          sVar36 = std::cout;
          pMVar33 = ABI::wasm2js::SCRATCH_STORE_F32;
          nextResult_46.str._M_str = (char *)cashew::RSHIFT;
          nextResult_46.str._M_len = EXPRESSION_RESULT;
          IVar41.str._M_str = cashew::RSHIFT;
          RVar20 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_46);
          target_10.str._M_str = (char *)RVar20.inst;
          target_10.str._M_len = sVar36;
          RVar20 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar33,target_10,IVar41.str._M_str);
          this = _cStack_38;
          sVar36 = _operator<<;
          pMVar33 = ABI::wasm2js::SCRATCH_LOAD_I32;
          RVar21 = cashew::ValueBuilder::makeDouble(2.0);
          target_11.str._M_str = (char *)RVar21.inst;
          target_11.str._M_len = sVar36;
          IVar41.str._M_str =
               cashew::ValueBuilder::makeCall<cashew::Ref>
                         ((ValueBuilder *)pMVar33,target_11,IVar41.str._M_str);
          goto LAB_0015151b;
        }
LAB_00151553:
        op_10.str._M_str = (char *)RVar20.inst;
        op_10.str._M_len = sVar38;
        IVar41.str._M_str = cashew::ValueBuilder::makeUnary(this_01,op_10,IVar41.str._M_str);
        break;
      }
      switch(iVar29) {
      case 0x2f:
        nextResult_33.str._M_str = (char *)cashew::RSHIFT;
        nextResult_33.str._M_len = EXPRESSION_RESULT;
        RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_33);
        sVar36 = ___cxa_begin_catch;
        IVar41.str._M_str = cashew::LSHIFT.inst;
        RVar21 = cashew::ValueBuilder::makeDouble(24.0);
        op_00.str._M_str = (char *)RVar21.inst;
        op_00.str._M_len = sVar36;
        RVar20 = cashew::ValueBuilder::makeBinary(RVar20.inst,IVar41.str._M_str,op_00,in_R8);
        uVar39 = 0x40380000;
        sVar36 = _insert;
        IVar41.str._M_str = cashew::RSHIFT;
        break;
      case 0x30:
        nextResult_48.str._M_str = (char *)cashew::RSHIFT;
        nextResult_48.str._M_len = EXPRESSION_RESULT;
        RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_48);
        sVar36 = ___cxa_begin_catch;
        IVar41.str._M_str = cashew::LSHIFT.inst;
        RVar21 = cashew::ValueBuilder::makeDouble(16.0);
        op_04.str._M_str = (char *)RVar21.inst;
        op_04.str._M_len = sVar36;
        RVar20 = cashew::ValueBuilder::makeBinary(RVar20.inst,IVar41.str._M_str,op_04,in_R8);
        uVar39 = 0x40300000;
        sVar36 = _insert;
        IVar41.str._M_str = cashew::RSHIFT;
        break;
      case 0x31:
      case 0x32:
      case 0x33:
switchD_00150e20_caseD_31:
        ::wasm::handle_unreachable
                  ("unhandled unary",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                   ,0x69c);
      case 0x34:
      case 0x36:
switchD_00150e20_caseD_34:
        nextResult_35.str._M_str = (char *)cashew::RSHIFT;
        nextResult_35.str._M_len = EXPRESSION_RESULT;
        RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_35);
        op_07.str._M_str = (char *)RVar20.inst;
        op_07.str._M_len = sVar10;
        RVar20 = cashew::ValueBuilder::makeUnary(this_00,op_07,IVar41.str._M_str);
        this_01 = this_00;
        sVar38 = sVar10;
        goto LAB_00151553;
      case 0x35:
      case 0x37:
switchD_00150e20_caseD_35:
        nextResult_36.str._M_str = (char *)cashew::RSHIFT;
        nextResult_36.str._M_len = EXPRESSION_RESULT;
        RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_36);
        op_08.str._M_str = (char *)RVar20.inst;
        op_08.str._M_len = sVar10;
        RVar20 = cashew::ValueBuilder::makeUnary(this_00,op_08,IVar41.str._M_str);
        op_09.str._M_str = (char *)RVar20.inst;
        op_09.str._M_len = sVar10;
        RVar20 = cashew::ValueBuilder::makeUnary(this_00,op_09,IVar41.str._M_str);
        uVar39 = 0;
        sVar36 = CEIL;
        IVar41.str._M_str = cashew::TRSHIFT.inst;
        break;
      default:
        if (iVar29 != 0) {
          if ((iVar29 == 2) || (iVar29 == 4)) {
            ::wasm::handle_unreachable
                      ("i32 unary should have been removed",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                       ,0x65c);
          }
          goto switchD_00150e20_caseD_31;
        }
        nextResult_45.str._M_str = (char *)cashew::RSHIFT;
        nextResult_45.str._M_len = EXPRESSION_RESULT;
        RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_45);
        goto LAB_0015062d;
      }
      RVar21 = cashew::ValueBuilder::makeDouble((double)((ulong)uVar39 << 0x20));
      goto LAB_0015097d;
    }
    switch(*(undefined4 *)(curr + 1)) {
    case 6:
    case 7:
      nextResult_12.str._M_str = (char *)cashew::RSHIFT;
      nextResult_12.str._M_len = EXPRESSION_RESULT;
      IVar41.str._M_str = cashew::RSHIFT;
      RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_12);
      op_06.str._M_str = (char *)RVar20.inst;
      op_06.str._M_len = sVar9;
      IVar41.str._M_str = cashew::ValueBuilder::makeUnary(pVVar31,op_06,IVar41.str._M_str);
      goto LAB_00151274;
    case 8:
    case 9:
      puVar26 = &MATH_ABS;
      break;
    case 10:
    case 0xb:
      puVar26 = &MATH_CEIL;
      break;
    case 0xc:
    case 0xd:
      puVar26 = &MATH_FLOOR;
      break;
    case 0xe:
    case 0xf:
      puVar26 = &MATH_TRUNC;
      break;
    case 0x10:
    case 0x11:
      ::wasm::handle_unreachable
                ("operation should have been removed in previous passes",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x6f2);
    case 0x12:
    case 0x13:
      puVar26 = &MATH_SQRT;
      break;
    default:
      ::wasm::handle_unreachable
                ("unhandled unary float operator",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x6f5);
    case 0x23:
      nextResult_44.str._M_str = (char *)cashew::RSHIFT;
      nextResult_44.str._M_len = EXPRESSION_RESULT;
      IVar41.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_44);
      IVar41.str._M_str = (Value *)makeJsCoercion(IVar41.str._M_str,JS_INT);
      goto LAB_0015142e;
    case 0x24:
      nextResult_42.str._M_str = (char *)cashew::RSHIFT;
      nextResult_42.str._M_len = EXPRESSION_RESULT;
      IVar41.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_42);
      IVar41.str._M_str = (Value *)makeJsCoercion(IVar41.str._M_str,JS_INT);
      goto LAB_001513ea;
    case 0x25:
      nextResult_39.str._M_str = (char *)cashew::RSHIFT;
      nextResult_39.str._M_len = EXPRESSION_RESULT;
      RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_39);
      sVar36 = CEIL;
      IVar41.str._M_str = cashew::TRSHIFT.inst;
      RVar21 = cashew::ValueBuilder::makeDouble(0.0);
      op_02.str._M_str = (char *)RVar21.inst;
      op_02.str._M_len = sVar36;
      IVar41.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar20.inst,IVar41.str._M_str,op_02,in_R8);
      goto LAB_0015142e;
    case 0x26:
      nextResult_41.str._M_str = (char *)cashew::RSHIFT;
      nextResult_41.str._M_len = EXPRESSION_RESULT;
      RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_41);
      sVar36 = CEIL;
      IVar41.str._M_str = cashew::TRSHIFT.inst;
      RVar21 = cashew::ValueBuilder::makeDouble(0.0);
      op_03.str._M_str = (char *)RVar21.inst;
      op_03.str._M_len = sVar36;
      IVar41.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar20.inst,IVar41.str._M_str,op_03,in_R8);
      goto LAB_001513ea;
    case 0x2b:
      nextResult_38.str._M_str = (char *)cashew::RSHIFT;
      nextResult_38.str._M_len = EXPRESSION_RESULT;
      IVar41.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_38);
LAB_001513ea:
      JVar14 = JS_DOUBLE;
      goto LAB_00151430;
    case 0x2c:
      nextResult_43.str._M_str = (char *)cashew::RSHIFT;
      nextResult_43.str._M_len = EXPRESSION_RESULT;
      IVar41.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_43);
LAB_0015142e:
      JVar14 = JS_FLOAT;
LAB_00151430:
      goto LAB_00151434;
    case 0x2d:
      specific_06.str._M_str = (char *)&switchD_001502b7::switchdataD_0017f32c;
      specific_06.str._M_len = ABI::wasm2js::SCRATCH_LOAD_F64;
      puVar25 = &switchD_001502b7::switchdataD_0017f32c;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_I32,specific_06);
      specific_07.str._M_str = (char *)puVar25;
      specific_07.str._M_len = __Unwind_Resume;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_F32,specific_07);
      sVar36 = ABI::wasm2js::SCRATCH_LOAD_F64;
      pMVar33 = ABI::wasm2js::SCRATCH_STORE_I32;
      IVar41.str._M_str = cashew::ValueBuilder::makeDouble(2.0);
      nextResult_40.str._M_str = (char *)cashew::RSHIFT;
      nextResult_40.str._M_len = EXPRESSION_RESULT;
      RVar20 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_40);
      target_08.str._M_str = (char *)IVar41.str._M_str;
      target_08.str._M_len = sVar36;
      RVar20 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                         ((ValueBuilder *)pMVar33,target_08,RVar20,in_R8);
      this = _cStack_38;
      target_09.str._M_str = extraout_RDX_10;
      target_09.str._M_len = __Unwind_Resume;
      IVar41.str._M_str =
           cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::SCRATCH_LOAD_F32,target_09);
LAB_0015151b:
      IVar41.str._M_str = cashew::ValueBuilder::makeSeq(RVar20,IVar41.str._M_str);
      goto LAB_0015143c;
    }
    pVVar31 = (ValueBuilder *)*puVar26;
    sVar36 = puVar26[1];
    nextResult_37.str._M_str = (char *)cashew::RSHIFT;
    nextResult_37.str._M_len = EXPRESSION_RESULT;
    IVar41.str._M_str = cashew::RSHIFT;
    RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_37);
    target_07.str._M_str = (char *)RVar20.inst;
    target_07.str._M_len = sVar36;
    IVar41.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar31,target_07,IVar41.str._M_str);
LAB_00151274:
    if ((curr->type).id != 4) break;
    JVar14 = JS_FLOAT;
    goto LAB_00151434;
  case BinaryId:
    nextResult_07.str._M_str = (char *)cashew::RSHIFT;
    nextResult_07.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(this,(Expression *)curr[1].type.id,nextResult_07);
    this = _cStack_38;
    nextResult_08.str._M_str = (char *)cashew::RSHIFT;
    nextResult_08.str._M_len = EXPRESSION_RESULT;
    RVar21 = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_08);
    pTVar1 = &curr->type;
    BVar12 = Type::getBasic(pTVar1);
    if (BVar12 - f32 < 2) {
      switch(*(undefined4 *)(curr + 1)) {
      case 0x32:
      case 0x3f:
        puVar26 = &cashew::PLUS;
        break;
      case 0x33:
      case 0x40:
        puVar26 = &cashew::MINUS;
        break;
      case 0x34:
      case 0x41:
        puVar26 = &cashew::MUL;
        break;
      case 0x35:
      case 0x42:
        puVar26 = &cashew::DIV;
        break;
      default:
        ppcVar2 = &old.str._M_str;
        Fatal::Fatal((Fatal *)ppcVar2);
        Fatal::operator<<((Fatal *)ppcVar2,(char (*) [34])"Unhandled binary float operator: ");
        goto LAB_00151ab1;
      case 0x37:
      case 0x44:
        puVar26 = &MATH_MIN;
        goto LAB_0015106f;
      case 0x38:
      case 0x45:
        puVar26 = &MATH_MAX;
LAB_0015106f:
        target_06.str._M_str = (char *)RVar20.inst;
        target_06.str._M_len = puVar26[1];
        IVar41.str._M_str =
             cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                       ((ValueBuilder *)*puVar26,target_06,RVar21,in_R8);
        goto LAB_00151274;
      }
      op_01.str._M_str = (char *)RVar21.inst;
      op_01.str._M_len = puVar26[1];
      IVar41.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar20.inst,(Value *)*puVar26,op_01,in_R8);
      goto LAB_00151274;
    }
    if (BVar12 != i32) {
      Fatal::Fatal((Fatal *)&old.str._M_str);
      std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                      "Unhandled type in binary: ");
      Fatal::operator<<((Fatal *)&old.str._M_str,(Binary *)curr);
LAB_00151ab1:
      Fatal::~Fatal((Fatal *)&old.str._M_str);
    }
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      puVar26 = &cashew::PLUS;
      break;
    case 1:
      puVar26 = &cashew::MINUS;
      break;
    case 2:
      sVar36 = cashew::CONDITIONAL;
      pMVar33 = MATH_IMUL;
      if (pTVar1->id == 2) goto LAB_0014fde7;
      puVar26 = &cashew::MUL;
      goto LAB_00151857;
    case 3:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::DIV;
      goto LAB_0015179b;
    case 4:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_UNSIGNED);
      puVar26 = &cashew::DIV;
      goto LAB_00151741;
    case 5:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::MOD;
LAB_0015179b:
      target_01.str._M_str = *puVar26;
      sVar36 = puVar26[1];
      JVar8 = JS_SIGNED;
LAB_001517a7:
      RVar21.inst = (Value *)makeSigning(RVar21,JVar8);
      goto LAB_001517d0;
    case 6:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_UNSIGNED);
      puVar26 = &cashew::MOD;
LAB_00151741:
      target_01.str._M_str = *puVar26;
      sVar36 = puVar26[1];
      JVar8 = JS_UNSIGNED;
      goto LAB_001517a7;
    case 7:
      puVar26 = &cashew::AND;
      break;
    case 8:
      puVar26 = &cashew::OR;
      break;
    case 9:
      puVar26 = &cashew::XOR;
      break;
    case 10:
      puVar26 = &cashew::LSHIFT.inst;
      break;
    case 0xb:
      puVar26 = &cashew::RSHIFT;
      break;
    case 0xc:
      puVar26 = &cashew::TRSHIFT.inst;
      break;
    case 0xd:
    case 0xe:
      ::wasm::handle_unreachable
                ("should be removed already",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x77c);
    case 0xf:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::EQ;
      goto LAB_00151830;
    case 0x10:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::NE;
      goto LAB_00151830;
    case 0x11:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::LT;
      goto LAB_00151830;
    case 0x12:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_UNSIGNED);
      puVar26 = &cashew::LT;
      goto LAB_0015180d;
    case 0x13:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::LE;
      goto LAB_00151830;
    case 0x14:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_UNSIGNED);
      puVar26 = &cashew::LE;
      goto LAB_0015180d;
    case 0x15:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::GT;
      goto LAB_00151830;
    case 0x16:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_UNSIGNED);
      puVar26 = &cashew::GT;
      goto LAB_0015180d;
    case 0x17:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_SIGNED);
      puVar26 = &cashew::GE;
LAB_00151830:
      IVar41.str._M_str = (Value *)*puVar26;
      sVar36 = puVar26[1];
      JVar8 = JS_SIGNED;
LAB_0015183c:
      RVar21.inst = (Value *)makeSigning(RVar21,JVar8);
      goto LAB_0015097d;
    case 0x18:
      RVar20.inst = (Value *)makeSigning(RVar20,JS_UNSIGNED);
      puVar26 = &cashew::GE;
LAB_0015180d:
      IVar41.str._M_str = (Value *)*puVar26;
      sVar36 = puVar26[1];
      JVar8 = JS_UNSIGNED;
      goto LAB_0015183c;
    default:
      ::wasm::handle_unreachable
                ("unhandled i32 binary operator",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x77e);
    case 0x39:
    case 0x46:
      puVar26 = &cashew::EQ;
      goto LAB_00151857;
    case 0x3a:
    case 0x47:
      puVar26 = &cashew::NE;
      goto LAB_00151857;
    case 0x3b:
    case 0x48:
      puVar26 = &cashew::LT;
      goto LAB_00151857;
    case 0x3c:
    case 0x49:
      puVar26 = &cashew::LE;
      goto LAB_00151857;
    case 0x3d:
    case 0x4a:
      puVar26 = &cashew::GT;
      goto LAB_00151857;
    case 0x3e:
    case 0x4b:
      puVar26 = &cashew::GE;
LAB_00151857:
      sVar36 = puVar26[1];
      IVar41.str._M_str = (Value *)*puVar26;
LAB_0015097d:
      op.str._M_str = (char *)RVar21.inst;
      op.str._M_len = sVar36;
      IVar41.str._M_str = cashew::ValueBuilder::makeBinary(RVar20.inst,IVar41.str._M_str,op,in_R8);
      goto LAB_0015143c;
    }
    target_01.str._M_str = *puVar26;
    sVar36 = puVar26[1];
LAB_001517d0:
    op_05.str._M_str = (char *)RVar21.inst;
    op_05.str._M_len = sVar36;
    IVar41.str._M_str =
         cashew::ValueBuilder::makeBinary(RVar20.inst,(Ref)target_01.str._M_str,op_05,in_R8);
    pwVar35 = (wasm *)pTVar1->id;
LAB_0015086e:
    JVar14 = ::wasm::wasmToJsType(pwVar35,target_01.str._M_str);
LAB_00151434:
    IVar41.str._M_str = (Value *)makeJsCoercion(IVar41.str._M_str,JVar14);
    break;
  case SelectId:
    IVar41.str._M_str = visitSelect(wasm::Select__(this,(Select *)curr);
    break;
  case DropId:
    pEVar32 = *(Expression **)(curr + 1);
    IVar41.str._M_str = _finalize;
    name_01.str._M_str = NO_RESULT;
LAB_001506b5:
    nextResult_20.str._M_str = (char *)IVar41.str._M_str;
    nextResult_20.str._M_len = (size_t)name_01.str._M_str;
    IVar41.str._M_str = IString_(this,pEVar32,nextResult_20);
    break;
  case ReturnId:
    target_01.str._M_str = *(uintptr_t *)(curr + 1);
    if ((Expression *)target_01.str._M_str == (Expression *)0x0) {
      IVar41.str._M_str = (Value *)0x0;
    }
    else {
      nextResult_21.str._M_str = (char *)cashew::RSHIFT;
      nextResult_21.str._M_len = EXPRESSION_RESULT;
      IVar41.str._M_str = IString_(this,(Expression *)target_01.str._M_str,nextResult_21);
      if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
        target_01.str._M_str = *(undefined8 *)((long)this + 0x18);
        sVar19 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)(*this + 0x380),(key_type *)target_01.str._M_str);
        if (sVar19 == 0) goto LAB_00150db0;
      }
      JVar14 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_01.str._M_str);
      IVar41.str._M_str = (Value *)makeJsCoercion(IVar41.str._M_str,JVar14);
    }
LAB_00150db0:
    IVar41.str._M_str = cashew::ValueBuilder::makeReturn(IVar41.str._M_str);
    break;
  case MemorySizeId:
    pVVar31 = FUNCTION_TABLE;
    pMVar33 = WASM_MEMORY_SIZE;
    goto LAB_0015065e;
  case MemoryGrowId:
    pwVar34 = *(wasm2js **)((long)this + 0x20);
    if ((*(long **)(pwVar34 + 0x78) == *(long **)(pwVar34 + 0x80)) ||
       (lVar17 = **(long **)(pwVar34 + 0x78), IVar41.str._M_str = *(Value **)(lVar17 + 0x40),
       IVar41.str._M_str <= *(Value **)(lVar17 + 0x38))) goto LAB_00150640;
    target_01.str._M_str = *(uintptr_t *)(curr + 1);
    nextResult_19.str._M_str = (char *)cashew::RSHIFT;
    nextResult_19.str._M_len = EXPRESSION_RESULT;
    IVar41.str._M_str = cashew::RSHIFT;
    RVar20 = IString_(this,(Expression *)target_01.str._M_str,nextResult_19);
    JVar14 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_01.str._M_str);
    RVar20.inst = (Value *)makeJsCoercion(RVar20,JVar14);
    goto LAB_0015062d;
  case NopId:
  case AtomicFenceId:
    IVar41.str._M_str = cashew::ValueBuilder::makeToplevel();
    break;
  case UnreachableId:
    pwVar34 = *(wasm2js **)((long)this + 0x20);
LAB_00150640:
    specific_03.str._M_str = (char *)IVar41.str._M_str;
    specific_03.str._M_len = (size_t)__M_create;
    ABI::wasm2js::ensureHelpers(pwVar34,ABI::wasm2js::TRAP,specific_03);
    name_01.str._M_str = extraout_RDX_02;
    pVVar31 = __M_create;
    pMVar33 = ABI::wasm2js::TRAP;
LAB_0015065e:
    this = _cStack_38;
    target_03.str._M_str = name_01.str._M_str;
    target_03.str._M_len = (size_t)pVVar31;
    IVar41.str._M_str = cashew::ValueBuilder::makeCall((ValueBuilder *)pMVar33,target_03);
    break;
  case AtomicRMWId:
    HVar43 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)curr[1].field_0x4,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    puVar25 = &switchD_001500fd::switchdataD_0017f428;
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      name_01.str._M_str = "add";
      break;
    case 1:
      name_01.str._M_str = "sub";
      break;
    case 2:
      name_01.str._M_str = "and";
      break;
    case 3:
      name_01.str._M_str = "or";
      break;
    case 4:
      name_01.str._M_str = "xor";
      break;
    case 5:
      name_01.str._M_str = "exchange";
      break;
    default:
      ::wasm::handle_unreachable
                ("unimp",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x82f);
    }
    IString::IString((IString *)&old.str._M_str,name_01.str._M_str);
    key_01.str._M_len._4_4_ = targetIndexes._M_t._M_impl._4_4_;
    key_01.str._M_len._0_4_ = targetIndexes._M_t._M_impl._0_4_;
    name_13.str._M_str = extraout_RDX_07;
    name_13.str._M_len = _makeJsCoercedZero;
    IVar41.str._M_str = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_13);
    key_01.str._M_str = (char *)puVar25;
    IVar41.str._M_str = cashew::ValueBuilder::makeDot(IVar41.str._M_str,(Ref)old.str._M_str,key_01);
    IVar41.str._M_str = cashew::ValueBuilder::makeCall(IVar41.str._M_str);
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,HVar43.heap.inst);
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,HVar43.ptr.inst);
    nextResult_34.str._M_str = (char *)cashew::RSHIFT;
    nextResult_34.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(this,(Expression *)curr[2].type.id,nextResult_34);
    goto LAB_00150fd4;
  case AtomicCmpxchgId:
    HVar43 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)curr[1]._id,*(Expression **)(curr + 2),(Index)curr[1].type.id);
    nextResult_23.str._M_str = (char *)cashew::RSHIFT;
    nextResult_23.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(_cStack_38,(Expression *)curr[2].type.id,nextResult_23);
    this = _cStack_38;
    nextResult_24.str._M_str = (char *)cashew::RSHIFT;
    nextResult_24.str._M_len = EXPRESSION_RESULT;
    target_01.str._M_str = (uintptr_t)IString_(_cStack_38,*(Expression **)(curr + 3),nextResult_24);
    name_05.str._M_str = extraout_RDX_04;
    name_05.str._M_len = _makeJsCoercedZero;
    IVar41.str._M_str = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_05);
    key.str._M_str = (char *)&cashew::COMPARE_EXCHANGE;
    key.str._M_len = _isIdentPart;
    IVar41.str._M_str =
         cashew::ValueBuilder::makeDot(IVar41.str._M_str,cashew::COMPARE_EXCHANGE,key);
    IVar41.str._M_str = cashew::ValueBuilder::makeCall(IVar41.str._M_str);
    RStack_50 = HVar43.heap.inst;
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,RStack_50);
    local_48 = HVar43.ptr.inst;
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,local_48);
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,RVar20);
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,(Ref)target_01.str._M_str);
    pwVar35 = (wasm *)(curr->type).id;
    goto LAB_0015086e;
  case AtomicWaitId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case PopId:
  case TableInitId:
  case TryId:
  case TryTableId:
  case ThrowId:
  case RethrowId:
  case ThrowRefId:
  case TupleMakeId:
  case TupleExtractId:
  case RefI31Id:
  case I31GetId:
  case CallRefId:
  case RefTestId:
  case RefCastId:
  case BrOnId:
  case StructNewId:
  case StructGetId:
  case StructSetId:
  case StructRMWId:
  case StructCmpxchgId:
  case ArrayNewId:
  case ArrayNewDataId:
  case ArrayNewElemId:
  case ArrayNewFixedId:
  case ArrayGetId:
  case ArraySetId:
  case ArrayLenId:
  case ArrayCopyId:
  case ArrayFillId:
  case ArrayInitDataId:
  case ArrayInitElemId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringWTF16GetId:
  case StringSliceWTFId:
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
    unimplemented(wasm::Expression__(curr,(Expression *)&switchD_0014fd4e::switchdataD_0017f030);
    goto LAB_00151871;
  case AtomicNotifyId:
    name_06.str._M_str = name_01.str._M_str;
    name_06.str._M_len = _makeJsCoercedZero;
    RVar20 = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_06);
    IString::IString((IString *)&old.str._M_str,"notify");
    key_00.str._M_len._4_4_ = targetIndexes._M_t._M_impl._4_4_;
    key_00.str._M_len._0_4_ = targetIndexes._M_t._M_impl._0_4_;
    key_00.str._M_str = (char *)IVar41.str._M_str;
    IVar41.str._M_str = cashew::ValueBuilder::makeDot(RVar20.inst,(Ref)old.str._M_str,key_00);
    IVar41.str._M_str = cashew::ValueBuilder::makeCall(IVar41.str._M_str);
    name_07.str._M_str = extraout_RDX_05;
    name_07.str._M_len = cashew::HEAP16;
    RVar20 = cashew::ValueBuilder::makeName(cashew::HEAP32,name_07);
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,RVar20);
    RVar20 = makePointer(wasm::Expression*,wasm::Address_
                       (this,(Expression *)curr[1].type.id,(Address)*(address64_t *)(curr + 1));
    RVar20 = cashew::ValueBuilder::makePtrShift(RVar20,2);
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,RVar20);
    nextResult_25.str._M_str = (char *)cashew::RSHIFT;
    nextResult_25.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(this,*(Expression **)(curr + 2),nextResult_25);
    RVar20.inst = (Value *)makeSigning(RVar20,JS_UNSIGNED);
LAB_00150fd4:
    cashew::ValueBuilder::appendToCall(IVar41.str._M_str,RVar20);
    break;
  case MemoryInitId:
    specific_00.str._M_str = (char *)IVar41.str._M_str;
    specific_00.str._M_len = _finalize;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::MEMORY_INIT,specific_00);
    sVar36 = _finalize;
    pMVar33 = ABI::wasm2js::MEMORY_INIT;
    IVar13 = getDataIndex((Wasm2JSBuilder *)_cStack_38->inst,(Name)curr[1]);
    IVar41.str._M_str = cashew::ValueBuilder::makeDouble((double)IVar13);
    nextResult_04.str._M_str = (char *)cashew::RSHIFT;
    nextResult_04.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_04);
    nextResult_05.str._M_str = (char *)cashew::RSHIFT;
    nextResult_05.str._M_len = EXPRESSION_RESULT;
    RVar21 = IString_(_cStack_38,(Expression *)curr[2].type.id,nextResult_05);
    this = _cStack_38;
    nextResult_06.str._M_str = (char *)cashew::RSHIFT;
    nextResult_06.str._M_len = EXPRESSION_RESULT;
    args_2 = IString_(_cStack_38,*(Expression **)(curr + 3),nextResult_06);
    target_00.str._M_str = (char *)IVar41.str._M_str;
    target_00.str._M_len = sVar36;
    IVar41.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
                   ((ValueBuilder *)pMVar33,target_00,RVar20,RVar21,args_2,args_3);
    break;
  case DataDropId:
    specific_02.str._M_str = (char *)IVar41.str._M_str;
    specific_02.str._M_len = _dump;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::DATA_DROP,specific_02);
    this = _cStack_38;
    sVar36 = _dump;
    pMVar33 = ABI::wasm2js::DATA_DROP;
    IVar13 = getDataIndex((Wasm2JSBuilder *)_cStack_38->inst,(Name)curr[1]);
    RVar20 = cashew::ValueBuilder::makeDouble((double)IVar13);
LAB_0015062d:
    target_02.str._M_str = (char *)RVar20.inst;
    target_02.str._M_len = sVar36;
    IVar41.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>
                   ((ValueBuilder *)pMVar33,target_02,IVar41.str._M_str);
    break;
  case MemoryCopyId:
    pwVar34 = *(wasm2js **)((long)this + 0x20);
    puVar26 = &ABI::wasm2js::MEMORY_COPY;
    goto LAB_001509d2;
  case MemoryFillId:
    pwVar34 = *(wasm2js **)((long)this + 0x20);
    puVar26 = &ABI::wasm2js::MEMORY_FILL;
    goto LAB_001509d2;
  case RefNullId:
    sVar40._M_str = name_01.str._M_str;
    sVar40._M_len = (size_t)NULL_;
    name_01.str._M_str = UINT32ARRAY;
    goto LAB_00150315;
  case RefIsNullId:
    nextResult_26.str._M_str = (char *)cashew::RSHIFT;
    nextResult_26.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(this,*(Expression **)(curr + 1),nextResult_26);
    sVar36 = cashew::BREAK;
    IVar41.str._M_str = cashew::EQ;
    name_08.str._M_str = extraout_RDX_06;
    name_08.str._M_len = (size_t)UINT32ARRAY;
    RVar21 = cashew::ValueBuilder::makeName(NULL_,name_08);
    goto LAB_0015097d;
  case RefEqId:
    nextResult_02.str._M_str = (char *)cashew::RSHIFT;
    nextResult_02.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(this,*(Expression **)(curr + 1),nextResult_02);
    this = _cStack_38;
    sVar36 = cashew::BREAK;
    IVar41.str._M_str = cashew::EQ;
    nextResult_03.str._M_str = (char *)cashew::RSHIFT;
    nextResult_03.str._M_len = EXPRESSION_RESULT;
    RVar21 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_03);
    goto LAB_0015097d;
  case TableGetId:
    name_09.str._M_str = name_01.str._M_str;
    name_09.str._M_len = _isalnum;
    IVar41.str._M_str = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_09);
    nextResult_27.str._M_str = (char *)cashew::RSHIFT;
    nextResult_27.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(this,*(Expression **)(curr + 2),nextResult_27);
    IVar41.str._M_str = cashew::ValueBuilder::makeSub(IVar41.str._M_str,RVar20);
    break;
  case TableSetId:
    name_01.str._M_len = _isalnum;
    IVar41.str._M_str = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_01);
    nextResult_10.str._M_str = (char *)cashew::RSHIFT;
    nextResult_10.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_10);
    RVar20 = cashew::ValueBuilder::makeSub(IVar41.str._M_str,RVar20);
    this = _cStack_38;
    nextResult_11.str._M_str = (char *)cashew::RSHIFT;
    nextResult_11.str._M_len = EXPRESSION_RESULT;
    RVar21 = IString_(_cStack_38,(Expression *)curr[2].type.id,nextResult_11);
    sVar36 = BLOCK;
    IVar41.str._M_str = cashew::SET;
    goto LAB_0015097d;
  case TableSizeId:
    name_03.str._M_str = name_01.str._M_str;
    name_03.str._M_len = _isalnum;
    IVar41.str._M_str = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_03);
    name_04.str._M_str = extraout_RDX_01;
    name_04.str._M_len = cashew::WHILE;
    RVar20 = cashew::ValueBuilder::makeName(LENGTH,name_04);
    IVar41.str._M_str = cashew::ValueBuilder::makeDot(IVar41.str._M_str,RVar20);
    break;
  case TableGrowId:
    IVar41.str._M_len = _getStruct;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_GROW,IVar41);
    specific.str._M_str = (char *)IVar41.str._M_str;
    specific.str._M_len = cashew::CALL;
    ABI::wasm2js::ensureHelpers((wasm2js *)_cStack_38[4].inst,ABI::wasm2js::TABLE_FILL,specific);
    sVar36 = _getStruct;
    pMVar33 = ABI::wasm2js::TABLE_GROW;
    nextResult_00.str._M_str = (char *)cashew::RSHIFT;
    nextResult_00.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_00);
    this = _cStack_38;
    nextResult_01.str._M_str = (char *)cashew::RSHIFT;
    nextResult_01.str._M_len = EXPRESSION_RESULT;
    RVar21 = IString_(_cStack_38,(Expression *)curr[2].type.id,nextResult_01);
LAB_0014fde7:
    target.str._M_str = (char *)RVar20.inst;
    target.str._M_len = sVar36;
    IVar41.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                   ((ValueBuilder *)pMVar33,target,RVar21,in_R8);
    break;
  case TableFillId:
    specific_01.str._M_str = (char *)IVar41.str._M_str;
    specific_01.str._M_len = cashew::CALL;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_FILL,specific_01);
    sVar36 = cashew::CALL;
    pMVar33 = ABI::wasm2js::TABLE_FILL;
    nextResult_16.str._M_str = (char *)cashew::RSHIFT;
    nextResult_16.str._M_len = EXPRESSION_RESULT;
    IVar41.str._M_str = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_16);
    nextResult_17.str._M_str = (char *)cashew::RSHIFT;
    nextResult_17.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(_cStack_38,(Expression *)curr[2].type.id,nextResult_17);
    pEVar32 = *(Expression **)(curr + 3);
    goto LAB_00150a21;
  case TableCopyId:
    pwVar34 = *(wasm2js **)((long)this + 0x20);
    puVar26 = &ABI::wasm2js::TABLE_COPY;
LAB_001509d2:
    specific_05.str._M_str = (char *)IVar41.str._M_str;
    specific_05.str._M_len = puVar26[1];
    ABI::wasm2js::ensureHelpers(pwVar34,(Module *)*puVar26,specific_05);
    pMVar33 = (Module *)*puVar26;
    sVar36 = puVar26[1];
    nextResult_28.str._M_str = (char *)cashew::RSHIFT;
    nextResult_28.str._M_len = EXPRESSION_RESULT;
    IVar41.str._M_str = IString_(_cStack_38,*(Expression **)(curr + 1),nextResult_28);
    nextResult_29.str._M_str = (char *)cashew::RSHIFT;
    nextResult_29.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_29);
    pEVar32 = *(Expression **)(curr + 2);
LAB_00150a21:
    this = _cStack_38;
    nextResult_30.str._M_str = (char *)cashew::RSHIFT;
    nextResult_30.str._M_len = EXPRESSION_RESULT;
    RVar21 = IString_(_cStack_38,pEVar32,nextResult_30);
    target_05.str._M_str = (char *)IVar41.str._M_str;
    target_05.str._M_len = sVar36;
    IVar41.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref>
                   ((ValueBuilder *)pMVar33,target_05,RVar20,RVar21,in_R9);
    break;
  case RefAsId:
    if (*(int *)(curr + 1) != 0) {
      __assert_fail("curr->op == RefAsNonNull",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                    ,0x969,
                    "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitRefAs(RefAs *)"
                   );
    }
    specific_04.str._M_str = (char *)IVar41.str._M_str;
    specific_04.str._M_len = (size_t)__M_create;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TRAP,specific_04);
    nextResult_22.str._M_str = (char *)cashew::RSHIFT;
    nextResult_22.str._M_len = EXPRESSION_RESULT;
    RVar20 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_22);
    IString::IString((IString *)&old.str._M_str,"||");
    this = _cStack_38;
    target_04.str._M_str = extraout_RDX_03;
    target_04.str._M_len = (size_t)__M_create;
    RVar21 = cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::TRAP,target_04);
    sVar36 = CONCAT44(targetIndexes._M_t._M_impl._4_4_,targetIndexes._M_t._M_impl._0_4_);
    IVar41.str._M_str = (Value *)old.str._M_str;
    goto LAB_0015097d;
  default:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
               ,0x46);
  }
LAB_0015143c:
  ((Ref *)((long)this + 8))->inst = args_3.inst;
  ((Ref *)((long)this + 0x10))->inst = (Value *)old.str._M_len;
  return (Ref)IVar41.str._M_str;
}

Assistant:

Ref visit(Expression* curr, IString nextResult) {
      IString old = result;
      result = nextResult;
      Ref ret = OverriddenVisitor::visit(curr);
      // keep it consistent for the rest of this frame, which may call visit on
      // multiple children
      result = old;
      return ret;
    }